

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upcast_test.cc
# Opt level: O1

void intgemm::kernel_upcast8to32_test<(intgemm::CPUType)3>(void)

{
  int iVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 *puVar9;
  undefined8 uVar10;
  char cVar11;
  long lVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar30 [32];
  AlignedVector<int> output;
  AlignedVector<signed_char> input;
  AssertionHandler catchAssertionHandler;
  int local_14c;
  AlignedVector<int> local_148;
  AlignedVector<signed_char> local_138;
  undefined1 local_128 [32];
  SourceLineInfo local_108;
  undefined1 local_f8 [32];
  ITransientExpression local_d8;
  undefined1 *local_c8;
  char *local_c0;
  size_t sStack_b8;
  int *local_b0;
  StringRef local_a8;
  undefined1 local_98 [32];
  AssertionHandler local_78;
  undefined1 auVar15 [32];
  
  auVar29 = in_ZMM12._0_32_;
  auVar27 = in_ZMM10._0_16_;
  if (2 < kCPU) {
    AlignedVector<signed_char>::AlignedVector(&local_138,0x20,0x40);
    AlignedVector<int>::AlignedVector(&local_148,0x20,0x40);
    if (local_138.size_ != 0) {
      lVar12 = local_138.size_ - 1;
      auVar14._8_8_ = lVar12;
      auVar14._0_8_ = lVar12;
      auVar15._16_8_ = lVar12;
      auVar15._0_16_ = auVar14;
      auVar15._24_8_ = lVar12;
      uVar13 = 0;
      auVar24 = vpmovsxbq_avx2(ZEXT416(0x17161514));
      auVar25 = vpmovsxbq_avx2(ZEXT416(0x13121110));
      auVar2 = vpmovsxbq_avx2(ZEXT416(0xf0e0d0c));
      auVar3 = vpmovsxbq_avx2(ZEXT416(0xb0a0908));
      auVar4 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar5 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar26._8_8_ = 0x8000000000000000;
      auVar26._0_8_ = 0x8000000000000000;
      auVar27 = vpcmpeqd_avx(auVar27,auVar27);
      auVar28._8_8_ = 0x8000000000000000;
      auVar28._0_8_ = 0x8000000000000000;
      auVar28._16_8_ = 0x8000000000000000;
      auVar28._24_8_ = 0x8000000000000000;
      auVar29 = vpcmpeqd_avx2(auVar29,auVar29);
      do {
        auVar30._8_8_ = uVar13;
        auVar30._0_8_ = uVar13;
        auVar30._16_8_ = uVar13;
        auVar30._24_8_ = uVar13;
        auVar6 = vpor_avx2(auVar30,auVar5);
        auVar16 = vpcmpgtq_avx(auVar6._0_16_ ^ auVar26,auVar26 ^ auVar14);
        auVar16 = vpackssdw_avx(auVar16,auVar16);
        auVar16 = vpackssdw_avx(auVar27 ^ auVar16,auVar27 ^ auVar16);
        auVar16 = vpacksswb_avx(auVar16,auVar16);
        cVar11 = (char)uVar13;
        if ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13] = cVar11 + -0x10;
        }
        auVar16 = vpcmpgtq_avx(auVar6._0_16_ ^ auVar26,auVar26 ^ auVar14);
        auVar16 = vpackssdw_avx(auVar16,auVar16);
        auVar16 = vpackssdw_avx(auVar27 ^ auVar16,auVar27 ^ auVar16);
        auVar16 = vpacksswb_avx(auVar16,auVar16);
        if ((auVar16 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 1] = cVar11 + -0xf;
        }
        auVar8 = auVar28 ^ auVar15;
        auVar6 = vpcmpgtq_avx2(auVar6 ^ auVar28,auVar8);
        auVar7 = vpshuflw_avx2(auVar6,0xe8);
        auVar16._0_4_ = auVar7._16_4_;
        auVar16._4_4_ = auVar16._0_4_;
        auVar16._8_4_ = auVar16._0_4_;
        auVar16._12_4_ = auVar16._0_4_;
        auVar16 = vpackssdw_avx(auVar27 ^ auVar16,auVar27 ^ auVar16);
        auVar16 = vpacksswb_avx(auVar16,auVar16);
        if ((auVar16 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 2] = cVar11 + -0xe;
        }
        auVar16 = vpackssdw_avx(auVar6._16_16_,auVar6._16_16_);
        auVar16 = vpackssdw_avx(auVar27 ^ auVar16,auVar27 ^ auVar16);
        auVar16 = vpacksswb_avx(auVar16,auVar16);
        if ((auVar16 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 3] = cVar11 + -0xd;
        }
        auVar7 = vpor_avx2(auVar30,auVar4);
        auVar16 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar26,auVar26 ^ auVar14);
        auVar16 = vpackssdw_avx(auVar16,auVar16);
        auVar6 = vpermq_avx2(ZEXT1632(auVar27 ^ auVar16),0x55);
        auVar6 = vpackssdw_avx2(auVar6,auVar15);
        auVar17._0_2_ = auVar6._16_2_;
        auVar17._2_2_ = auVar17._0_2_;
        auVar17._4_2_ = auVar17._0_2_;
        auVar17._6_2_ = auVar17._0_2_;
        auVar17._8_2_ = auVar17._0_2_;
        auVar17._10_2_ = auVar17._0_2_;
        auVar17._12_2_ = auVar17._0_2_;
        auVar17._14_2_ = auVar17._0_2_;
        auVar16 = vpacksswb_avx(auVar17,auVar17);
        if ((auVar16 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 4] = cVar11 + -0xc;
        }
        auVar16 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar26,auVar26 ^ auVar14);
        auVar16 = vpshufhw_avx(auVar16,0x84);
        auVar6 = vpermq_avx2(ZEXT1632(auVar27 ^ auVar16),0x55);
        auVar6 = vpackssdw_avx2(auVar6,auVar15);
        auVar18._0_4_ = auVar6._16_4_;
        auVar18._4_4_ = auVar18._0_4_;
        auVar18._8_4_ = auVar18._0_4_;
        auVar18._12_4_ = auVar18._0_4_;
        auVar16 = vpacksswb_avx(auVar18,auVar18);
        if ((auVar16 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 5] = cVar11 + -0xb;
        }
        auVar7 = vpcmpgtq_avx2(auVar7 ^ auVar28,auVar8);
        auVar6 = vpackssdw_avx2(auVar15,auVar7);
        auVar16 = auVar27 ^ auVar6._16_16_;
        auVar16 = vpackssdw_avx(auVar16,auVar16);
        auVar16 = vpacksswb_avx(auVar16,auVar16);
        if ((auVar16 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 6] = cVar11 + -10;
        }
        auVar6 = vpshufhw_avx2(auVar7,0x84);
        auVar16 = auVar27 ^ auVar6._16_16_;
        auVar16 = vpackssdw_avx(auVar16,auVar16);
        auVar16 = vpacksswb_avx(auVar16,auVar16);
        if ((auVar16 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 7] = cVar11 + -9;
        }
        auVar7 = vpor_avx2(auVar30,auVar3);
        auVar16 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar26,auVar26 ^ auVar14);
        auVar16 = vpackssdw_avx(auVar16,auVar16);
        auVar16 = vpackssdw_avx(auVar27 ^ auVar16,auVar27 ^ auVar16);
        auVar6 = vpmovzxwd_avx2(auVar16);
        auVar6 = vpacksswb_avx2(auVar6,auVar15);
        if ((auVar6 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
          local_138.mem_[uVar13 + 8] = cVar11 + -8;
        }
        auVar16 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar26,auVar26 ^ auVar14);
        auVar16 = vpackssdw_avx(auVar16,auVar16);
        auVar16 = vpackssdw_avx(auVar27 ^ auVar16,auVar27 ^ auVar16);
        auVar6 = vpermq_avx2(ZEXT1632(auVar16),0x55);
        auVar6 = vpacksswb_avx2(auVar6,auVar15);
        if ((auVar6._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 9] = cVar11 + -7;
        }
        auVar7 = vpcmpgtq_avx2(auVar7 ^ auVar28,auVar8);
        auVar6 = vpshuflw_avx2(auVar7,0xe8);
        auVar19._0_4_ = auVar6._16_4_;
        auVar19._4_4_ = auVar19._0_4_;
        auVar19._8_4_ = auVar19._0_4_;
        auVar19._12_4_ = auVar19._0_4_;
        auVar16 = vpackssdw_avx(auVar27 ^ auVar19,auVar27 ^ auVar19);
        auVar6 = vpermq_avx2(ZEXT1632(auVar16),0x55);
        auVar6 = vpacksswb_avx2(auVar6,auVar15);
        if ((auVar6._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 10] = cVar11 + -6;
        }
        auVar16 = vpackssdw_avx(auVar7._16_16_,auVar7._16_16_);
        auVar16 = vpackssdw_avx(auVar27 ^ auVar16,auVar27 ^ auVar16);
        auVar6 = vpermq_avx2(ZEXT1632(auVar16),0x55);
        auVar6 = vpacksswb_avx2(auVar6,auVar15);
        if ((auVar6._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 0xb] = cVar11 + -5;
        }
        auVar7 = vpor_avx2(auVar30,auVar2);
        auVar16 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar26,auVar26 ^ auVar14);
        auVar16 = vpackssdw_avx(auVar16,auVar16);
        auVar6 = vpermq_avx2(ZEXT1632(auVar27 ^ auVar16),0x55);
        auVar6 = vpackssdw_avx2(auVar15,auVar6);
        auVar6 = vpacksswb_avx2(auVar6,auVar15);
        if ((auVar6._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 0xc] = cVar11 + -4;
        }
        auVar16 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar26,auVar26 ^ auVar14);
        auVar16 = vpshufhw_avx(auVar16,0x84);
        auVar6 = vpermq_avx2(ZEXT1632(auVar27 ^ auVar16),0x55);
        auVar6 = vpackssdw_avx2(auVar15,auVar6);
        auVar6 = vpacksswb_avx2(auVar6,auVar15);
        if ((auVar6._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 0xd] = cVar11 + -3;
        }
        auVar7 = vpcmpgtq_avx2(auVar7 ^ auVar28,auVar8);
        auVar6 = vpackssdw_avx2(auVar15,auVar7);
        auVar6 = vpackssdw_avx2(auVar15,auVar29 ^ auVar6);
        auVar6 = vpacksswb_avx2(auVar6,auVar15);
        if ((auVar6._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 0xe] = cVar11 + -2;
        }
        auVar6 = vpshufhw_avx2(auVar7,0x84);
        auVar6 = vpackssdw_avx2(auVar15,auVar29 ^ auVar6);
        auVar6 = vpacksswb_avx2(auVar6,auVar15);
        if ((auVar6._16_16_ >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 0xf] = cVar11 + -1;
        }
        auVar6 = vpor_avx2(auVar30,auVar25);
        auVar16 = vpcmpgtq_avx(auVar6._0_16_ ^ auVar26,auVar26 ^ auVar14);
        auVar16 = vpackssdw_avx(auVar16,auVar16);
        auVar16 = vpackssdw_avx(auVar27 ^ auVar16,auVar27 ^ auVar16);
        auVar16 = vpacksswb_avx(auVar16,auVar16);
        if ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 0x10] = cVar11;
        }
        auVar16 = vpcmpgtq_avx(auVar6._0_16_ ^ auVar26,auVar26 ^ auVar14);
        auVar16 = vpackssdw_avx(auVar16,auVar16);
        auVar16 = vpackssdw_avx(auVar27 ^ auVar16,auVar27 ^ auVar16);
        auVar16 = vpacksswb_avx(auVar16,auVar16);
        if ((auVar16 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 0x11] = cVar11 + '\x01';
        }
        auVar6 = vpcmpgtq_avx2(auVar6 ^ auVar28,auVar8);
        auVar7 = vpshuflw_avx2(auVar6,0xe8);
        auVar20._0_4_ = auVar7._16_4_;
        auVar20._4_4_ = auVar20._0_4_;
        auVar20._8_4_ = auVar20._0_4_;
        auVar20._12_4_ = auVar20._0_4_;
        auVar16 = vpackssdw_avx(auVar27 ^ auVar20,auVar27 ^ auVar20);
        auVar16 = vpacksswb_avx(auVar16,auVar16);
        if ((auVar16 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 0x12] = cVar11 + '\x02';
        }
        auVar16 = vpackssdw_avx(auVar6._16_16_,auVar6._16_16_);
        auVar16 = vpackssdw_avx(auVar27 ^ auVar16,auVar27 ^ auVar16);
        auVar16 = vpacksswb_avx(auVar16,auVar16);
        if ((auVar16 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 0x13] = cVar11 + '\x03';
        }
        auVar7 = vpor_avx2(auVar30,auVar24);
        auVar16 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar26,auVar26 ^ auVar14);
        auVar16 = vpackssdw_avx(auVar16,auVar16);
        auVar6 = vpermq_avx2(ZEXT1632(auVar27 ^ auVar16),0x55);
        auVar6 = vpackssdw_avx2(auVar6,auVar15);
        auVar21._0_2_ = auVar6._16_2_;
        auVar21._2_2_ = auVar21._0_2_;
        auVar21._4_2_ = auVar21._0_2_;
        auVar21._6_2_ = auVar21._0_2_;
        auVar21._8_2_ = auVar21._0_2_;
        auVar21._10_2_ = auVar21._0_2_;
        auVar21._12_2_ = auVar21._0_2_;
        auVar21._14_2_ = auVar21._0_2_;
        auVar16 = vpacksswb_avx(auVar21,auVar21);
        if ((auVar16 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 0x14] = cVar11 + '\x04';
        }
        auVar16 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar26,auVar26 ^ auVar14);
        auVar16 = vpshufhw_avx(auVar16,0x84);
        auVar6 = vpermq_avx2(ZEXT1632(auVar27 ^ auVar16),0x55);
        auVar6 = vpackssdw_avx2(auVar6,auVar15);
        auVar22._0_4_ = auVar6._16_4_;
        auVar22._4_4_ = auVar22._0_4_;
        auVar22._8_4_ = auVar22._0_4_;
        auVar22._12_4_ = auVar22._0_4_;
        auVar16 = vpacksswb_avx(auVar22,auVar22);
        if ((auVar16 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 0x15] = cVar11 + '\x05';
        }
        auVar7 = vpcmpgtq_avx2(auVar7 ^ auVar28,auVar8);
        auVar6 = vpackssdw_avx2(auVar15,auVar7);
        auVar16 = auVar27 ^ auVar6._16_16_;
        auVar16 = vpackssdw_avx(auVar16,auVar16);
        auVar16 = vpacksswb_avx(auVar16,auVar16);
        if ((auVar16 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 0x16] = cVar11 + '\x06';
        }
        auVar6 = vpshufhw_avx2(auVar7,0x84);
        auVar16 = auVar27 ^ auVar6._16_16_;
        auVar16 = vpackssdw_avx(auVar16,auVar16);
        auVar16 = vpacksswb_avx(auVar16,auVar16);
        if ((auVar16 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 0x17] = cVar11 + '\a';
        }
        auVar7 = vpor_avx2(auVar30,_DAT_001b8f40);
        auVar16 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar26,auVar26 ^ auVar14);
        auVar16 = vpackssdw_avx(auVar16,auVar16);
        auVar16 = vpackssdw_avx(auVar27 ^ auVar16,auVar27 ^ auVar16);
        auVar6 = vpmovzxwd_avx2(auVar16);
        auVar6 = vpacksswb_avx2(auVar15,auVar6);
        if ((auVar6 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
          local_138.mem_[uVar13 + 0x18] = cVar11 + '\b';
        }
        auVar16 = vpcmpgtq_avx(auVar7._0_16_ ^ auVar26,auVar26 ^ auVar14);
        auVar16 = vpackssdw_avx(auVar16,auVar16);
        auVar16 = vpackssdw_avx(auVar27 ^ auVar16,auVar27 ^ auVar16);
        auVar6 = vpermq_avx2(ZEXT1632(auVar16),0x55);
        auVar6 = vpacksswb_avx2(auVar15,auVar6);
        if ((auVar6._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 0x19] = cVar11 + '\t';
        }
        auVar7 = vpcmpgtq_avx2(auVar7 ^ auVar28,auVar8);
        auVar6 = vpshuflw_avx2(auVar7,0xe8);
        auVar23._0_4_ = auVar6._16_4_;
        auVar23._4_4_ = auVar23._0_4_;
        auVar23._8_4_ = auVar23._0_4_;
        auVar23._12_4_ = auVar23._0_4_;
        auVar16 = vpackssdw_avx(auVar27 ^ auVar23,auVar27 ^ auVar23);
        auVar6 = vpermq_avx2(ZEXT1632(auVar16),0x55);
        auVar6 = vpacksswb_avx2(auVar15,auVar6);
        if ((auVar6._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 0x1a] = cVar11 + '\n';
        }
        auVar16 = vpackssdw_avx(auVar7._16_16_,auVar7._16_16_);
        auVar16 = vpackssdw_avx(auVar27 ^ auVar16,auVar27 ^ auVar16);
        auVar6 = vpermq_avx2(ZEXT1632(auVar16),0x55);
        auVar6 = vpacksswb_avx2(auVar15,auVar6);
        if ((auVar6._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 0x1b] = cVar11 + '\v';
        }
        auVar30 = vpor_avx2(auVar30,_DAT_001b8f20);
        auVar16 = vpcmpgtq_avx(auVar30._0_16_ ^ auVar26,auVar26 ^ auVar14);
        auVar16 = vpackssdw_avx(auVar16,auVar16);
        auVar6 = vpermq_avx2(ZEXT1632(auVar27 ^ auVar16),0x55);
        auVar6 = vpackssdw_avx2(auVar15,auVar6);
        auVar6 = vpacksswb_avx2(auVar15,auVar6);
        if ((auVar6._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 0x1c] = cVar11 + '\f';
        }
        auVar16 = vpcmpgtq_avx(auVar30._0_16_ ^ auVar26,auVar26 ^ auVar14);
        auVar16 = vpshufhw_avx(auVar16,0x84);
        auVar6 = vpermq_avx2(ZEXT1632(auVar27 ^ auVar16),0x55);
        auVar6 = vpackssdw_avx2(auVar15,auVar6);
        auVar6 = vpacksswb_avx2(auVar15,auVar6);
        if ((auVar6._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 0x1d] = cVar11 + '\r';
        }
        auVar30 = vpcmpgtq_avx2(auVar30 ^ auVar28,auVar8);
        auVar6 = vpackssdw_avx2(auVar15,auVar30);
        auVar6 = vpackssdw_avx2(auVar15,auVar29 ^ auVar6);
        auVar6 = vpacksswb_avx2(auVar15,auVar6);
        if ((auVar6._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 0x1e] = cVar11 + '\x0e';
        }
        auVar6 = vpshufhw_avx2(auVar30,0x84);
        auVar6 = vpackssdw_avx2(auVar15,auVar29 ^ auVar6);
        auVar6 = vpacksswb_avx2(auVar15,auVar6);
        if ((auVar6._16_16_ >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138.mem_[uVar13 + 0x1f] = cVar11 + '\x0f';
        }
        uVar13 = uVar13 + 0x20;
      } while ((local_138.size_ + 0x1f & 0xffffffffffffffe0) != uVar13);
    }
    auVar29 = *(undefined1 (*) [32])local_138.mem_;
    if (kernels::upcast8to16(long_long(int))::vzero == '\0') {
      local_128 = *(undefined1 (*) [32])local_138.mem_;
      kernel_upcast8to32_test<(intgemm::CPUType)3>();
      auVar29 = local_128;
    }
    auVar24 = kernels::upcast8to16(long_long(int))::vzero;
    if (kernels::upcast16to32(long_long(int))::vzero == '\0') {
      local_f8 = kernels::upcast8to16(long_long(int))::vzero;
      local_128 = auVar29;
      kernel_upcast8to32_test<(intgemm::CPUType)3>();
      auVar24 = local_f8;
      auVar29 = local_128;
    }
    auVar25 = kernels::upcast16to32(long_long(int))::vzero;
    if (kernels::upcast16to32(long_long(int))::vzero == '\0') {
      local_98 = kernels::upcast16to32(long_long(int))::vzero;
      local_128 = auVar29;
      local_f8 = auVar24;
      kernel_upcast8to32_test<(intgemm::CPUType)3>();
      auVar29 = local_128;
      auVar24 = local_f8;
      auVar25 = local_98;
    }
    auVar2 = vpermq_avx2(auVar29,0xd8);
    auVar29 = vpcmpgtb_avx2(auVar24,auVar2);
    auVar24 = vpunpcklbw_avx2(auVar2,auVar29);
    auVar3 = vpermq_avx2(auVar24,0xd8);
    auVar24 = vpcmpgtw_avx2(auVar25,auVar3);
    auVar25 = vpunpckhwd_avx2(auVar3,auVar24);
    auVar24 = vpunpcklwd_avx2(auVar3,auVar24);
    auVar29 = vpunpckhbw_avx2(auVar2,auVar29);
    auVar3 = vpermq_avx2(auVar29,0xd8);
    auVar29 = vpcmpgtw_avx2(kernels::upcast16to32(long_long(int))::vzero,auVar3);
    auVar2 = vpunpcklwd_avx2(auVar3,auVar29);
    auVar29 = vpunpckhwd_avx2(auVar3,auVar29);
    *(undefined1 (*) [32])local_148.mem_ = auVar24;
    *(undefined1 (*) [32])((long)local_148.mem_ + 0x20) = auVar25;
    *(undefined1 (*) [32])((long)local_148.mem_ + 0x40) = auVar2;
    *(undefined1 (*) [32])((long)local_148.mem_ + 0x60) = auVar29;
    if (local_148.size_ != 0) {
      lVar12 = 0;
      auVar29._24_8_ = 0;
      auVar29._0_24_ = local_128._8_24_;
      local_128 = auVar29 << 0x40;
      do {
        local_d8._vptr_ITransientExpression = (_func_int **)0x1b3b11;
        local_d8.m_isBinaryExpression = true;
        local_d8.m_result = false;
        local_d8._10_6_ = 0;
        local_108.file =
             "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/upcast_test.cc"
        ;
        local_108.line = 0x65;
        Catch::StringRef::StringRef(&local_a8,"output[i] == int32_t(input[i])");
        Catch::AssertionHandler::AssertionHandler
                  (&local_78,(StringRef *)&local_d8,&local_108,local_a8,ContinueOnFailure);
        cVar11 = local_138.mem_[local_128._0_8_];
        iVar1 = *(int *)((undefined1 *)local_148.mem_ + lVar12);
        local_f8._0_8_ = lVar12;
        puVar9 = (undefined1 *)local_148.mem_;
        local_14c = (int)cVar11;
        Catch::StringRef::StringRef((StringRef *)&local_108,"==");
        local_d8.m_result = iVar1 == cVar11;
        local_d8.m_isBinaryExpression = true;
        local_d8._vptr_ITransientExpression =
             (_func_int **)&PTR_streamReconstructedExpression_001ed958;
        local_c0 = local_108.file;
        sStack_b8 = local_108.line;
        local_b0 = &local_14c;
        local_c8 = puVar9 + lVar12;
        Catch::AssertionHandler::handleExpr(&local_78,&local_d8);
        Catch::ITransientExpression::~ITransientExpression(&local_d8);
        Catch::AssertionHandler::complete(&local_78);
        uVar10 = local_f8._0_8_;
        if (local_78.m_completed == false) {
          (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])
                    (local_78.m_resultCapture,&local_78);
        }
        uVar13 = local_128._0_8_ + 1;
        lVar12 = uVar10 + 4;
        local_128._0_8_ = uVar13;
      } while (uVar13 < local_148.size_);
    }
    free(local_148.mem_);
    free(local_138.mem_);
  }
  return;
}

Assistant:

void kernel_upcast8to32_test() {
  if (kCPU < CPUType_)
    return;

  using vi = vector_t<CPUType_, int>;
  constexpr int LENGTH = sizeof(vi) / sizeof(int8_t);

  AlignedVector<int8_t> input(LENGTH);
  AlignedVector<int32_t> output(LENGTH);

  std::iota(input.begin(), input.end(), static_cast<int8_t>(-LENGTH / 2));

  auto result = kernels::upcast8to32(*input.template as<vi>());
  output.template as<vi>()[0] = result.first;
  output.template as<vi>()[1] = result.second;
  output.template as<vi>()[2] = result.third;
  output.template as<vi>()[3] = result.fourth;

  for (std::size_t i = 0; i < output.size(); ++i)
    CHECK(output[i] == int32_t(input[i]));
}